

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  SimpleString *actual_00;
  long lVar5;
  SimpleString *pos;
  SimpleString printableActual;
  undefined1 local_60 [32];
  SimpleString local_40;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_003a7bf0;
  TestFailure::createUserText((TestFailure *)local_60,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  PrintableStringFromOrNull(local_60);
  PrintableStringFromOrNull((char *)&local_40);
  pcVar3 = SimpleString::asCharString((SimpleString *)local_60);
  pcVar4 = SimpleString::asCharString(&local_40);
  StringFromFormat(local_60 + 0x10,"expected <%s>\n\tbut was  <%s>",pcVar3,pcVar4);
  SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar5 = 0;
    while( true ) {
      cVar1 = SimpleString::ToLower(actual[lVar5]);
      cVar2 = SimpleString::ToLower(expected[lVar5]);
      if (cVar1 != cVar2) break;
      lVar5 = lVar5 + 1;
    }
    pos = (SimpleString *)0x0;
    while( true ) {
      cVar1 = SimpleString::at(&local_40,(size_t)pos);
      cVar1 = SimpleString::ToLower(cVar1);
      actual_00 = pos;
      cVar2 = SimpleString::at((SimpleString *)local_60,(size_t)pos);
      cVar2 = SimpleString::ToLower(cVar2);
      if (cVar1 != cVar2) break;
      pos = (SimpleString *)((long)&pos->buffer_ + 1);
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)(local_60 + 0x10),actual_00,(size_t)&local_40,(size_t)pos);
    SimpleString::operator+=(this_00,(SimpleString *)(local_60 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(local_60 + 0x10));
  }
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString((SimpleString *)local_60);
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected);
    SimpleString printableActual = PrintableStringFromOrNull(actual);

    message_ += createButWasString(printableExpected, printableActual);
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        size_t failStartPrintable;
        for (failStartPrintable = 0;
             SimpleString::ToLower(printableActual.at(failStartPrintable)) == SimpleString::ToLower(printableExpected.at(failStartPrintable));
             failStartPrintable++)
            ;
        message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
    }
}